

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeIntegrity(sqlite3_vtab *pVtab,char *zSchema,char *zName,int isQuick,char **pzErr)

{
  char *pcVar1;
  undefined4 in_ECX;
  char *in_RDX;
  sqlite3 *in_RSI;
  long in_RDI;
  char **in_R8;
  int rc;
  Rtree *pRtree;
  int local_34;
  undefined4 in_stack_ffffffffffffffe0;
  
  local_34 = rtreeCheckTable(in_RSI,in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8)
  ;
  if ((local_34 == 0) && (*in_R8 != (char *)0x0)) {
    pcVar1 = sqlite3_mprintf("In RTree %s.%s:\n%z",*(undefined8 *)(in_RDI + 0x30),
                             *(undefined8 *)(in_RDI + 0x38),*in_R8);
    *in_R8 = pcVar1;
    if (*in_R8 == (char *)0x0) {
      local_34 = 7;
    }
  }
  return local_34;
}

Assistant:

static int rtreeIntegrity(
  sqlite3_vtab *pVtab,   /* The virtual table to check */
  const char *zSchema,   /* Schema in which the virtual table lives */
  const char *zName,     /* Name of the virtual table */
  int isQuick,           /* True for a quick_check */
  char **pzErr           /* Write results here */
){
  Rtree *pRtree = (Rtree*)pVtab;
  int rc;
  assert( pzErr!=0 && *pzErr==0 );
  UNUSED_PARAMETER(zSchema);
  UNUSED_PARAMETER(zName);
  UNUSED_PARAMETER(isQuick);
  rc = rtreeCheckTable(pRtree->db, pRtree->zDb, pRtree->zName, pzErr);
  if( rc==SQLITE_OK && *pzErr ){
    *pzErr = sqlite3_mprintf("In RTree %s.%s:\n%z",
                 pRtree->zDb, pRtree->zName, *pzErr);
    if( (*pzErr)==0 ) rc = SQLITE_NOMEM;
  }
  return rc;
}